

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  Type *pTVar1;
  bool bVar2;
  int iVar3;
  SubroutineKind SVar4;
  undefined4 extraout_var;
  ExpressionStatement *stmt;
  Statement *pSVar5;
  Type *pTVar6;
  Diagnostic *this_00;
  string_view arg;
  SourceRange local_38;
  CallExpression *this;
  
  iVar3 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0x100);
  this = (CallExpression *)CONCAT44(extraout_var,iVar3);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)this,&local_38);
  bVar2 = Expression::bad((Expression *)this);
  if (!bVar2) {
    if ((this->super_Expression).kind == Call) {
      SVar4 = CallExpression::getSubroutineKind(this);
      if (SVar4 != Task) {
LAB_004c1239:
        pTVar1 = (this->super_Expression).type.ptr;
        pTVar6 = pTVar1->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          pTVar6 = pTVar1->canonical;
        }
        if ((pTVar6->super_Symbol).kind != VoidType) {
          return &stmt->super_Statement;
        }
        this_00 = ASTContext::addDiag(context,(DiagCode)0x5c0008,
                                      (this->super_Expression).sourceRange);
        arg = CallExpression::getSubroutineName(this);
        Diagnostic::operator<<(this_00,arg);
        return &stmt->super_Statement;
      }
      pTVar1 = (this->super_Expression).type.ptr;
      pTVar6 = pTVar1->canonical;
      if (pTVar6 == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
        pTVar6 = pTVar1->canonical;
      }
      if ((pTVar6->super_Symbol).kind != VoidType) goto LAB_004c1239;
    }
    ASTContext::addDiag(context,(DiagCode)0x510008,(this->super_Expression).sourceRange);
  }
  pSVar5 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar5;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context, ASTFlags::TopLevelStatement);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}